

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreutil.h
# Opt level: O2

path * irr::core::deletePathFromPath(path *filename,s32 pathCount)

{
  char cVar1;
  pointer pcVar2;
  uint uVar3;
  
  uVar3 = (uint)(filename->str)._M_string_length;
  pcVar2 = (filename->str)._M_dataplus._M_p;
  do {
    if ((int)uVar3 < 0) {
LAB_0021c480:
      string<char>::operator=(filename,"");
      return filename;
    }
    cVar1 = pcVar2[uVar3];
    if ((cVar1 == '\\') || (cVar1 == '/')) {
      if (pathCount < 2) {
        if (uVar3 != 0) {
          pcVar2[(ulong)uVar3 + 1] = '\0';
          string<char>::validate(filename);
          return filename;
        }
        goto LAB_0021c480;
      }
      pathCount = pathCount + -1;
    }
    uVar3 = uVar3 - 1;
  } while( true );
}

Assistant:

inline io::path &deletePathFromPath(io::path &filename, s32 pathCount)
{
	// delete path from filename
	s32 i = filename.size();

	// search for path separator or beginning
	while (i >= 0) {
		if (filename[i] == '/' || filename[i] == '\\') {
			if (--pathCount <= 0)
				break;
		}
		--i;
	}

	if (i > 0) {
		filename[i + 1] = 0;
		filename.validate();
	} else
		filename = "";
	return filename;
}